

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Object>
          (Structure *this,Object *dest,FileDatabase *db)

{
  element_type *peVar1;
  element_type *this_00;
  undefined1 local_38 [8];
  shared_ptr<Assimp::Blender::Object> parent;
  int temp;
  FileDatabase *db_local;
  Object *dest_local;
  Structure *this_local;
  
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  parent.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = Type_EMPTY;
  ReadField<2,int>(this,(int *)((long)&parent.
                                       super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi + 4),"type",db);
  dest->type = parent.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_;
  ReadFieldArray2<1,float,4ul,4ul>(this,&dest->obmat,"obmat",db);
  ReadFieldArray2<1,float,4ul,4ul>(this,&dest->parentinv,"parentinv",db);
  ReadFieldArray<1,char,32ul>(this,&dest->parsubstr,"parsubstr",db);
  ::std::shared_ptr<Assimp::Blender::Object>::shared_ptr
            ((shared_ptr<Assimp::Blender::Object> *)local_38);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,(shared_ptr<Assimp::Blender::Object> *)local_38,"*parent",db,false);
  peVar1 = ::std::__shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2> *)local_38)
  ;
  dest->parent = peVar1;
  ::std::shared_ptr<Assimp::Blender::Object>::~shared_ptr
            ((shared_ptr<Assimp::Blender::Object> *)local_38);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->track,"*track",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->proxy,"*proxy",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,&dest->proxy_from,"*proxy_from",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,&dest->proxy_group,"*proxy_group",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Group>
            (this,&dest->dup_group,"*dup_group",db,false);
  ReadFieldPtr<2,std::shared_ptr,Assimp::Blender::ElemBase>(this,&dest->data,"*data",db,false);
  ReadField<1,Assimp::Blender::ListBase>(this,&dest->modifiers,"modifiers",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<Object> (
    Object& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    int temp = 0;
    ReadField<ErrorPolicy_Fail>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Object::Type>(temp);
    ReadFieldArray2<ErrorPolicy_Warn>(dest.obmat,"obmat",db);
    ReadFieldArray2<ErrorPolicy_Warn>(dest.parentinv,"parentinv",db);
    ReadFieldArray<ErrorPolicy_Warn>(dest.parsubstr,"parsubstr",db);
    {
        std::shared_ptr<Object> parent;
        ReadFieldPtr<ErrorPolicy_Warn>(parent,"*parent",db);
        dest.parent = parent.get();
    }
    ReadFieldPtr<ErrorPolicy_Warn>(dest.track,"*track",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.proxy,"*proxy",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.proxy_from,"*proxy_from",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.proxy_group,"*proxy_group",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.dup_group,"*dup_group",db);
    ReadFieldPtr<ErrorPolicy_Fail>(dest.data,"*data",db);
    ReadField<ErrorPolicy_Igno>(dest.modifiers,"modifiers",db);

    db.reader->IncPtr(size);
}